

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::PopStyleColor(int count)

{
  ImVector<ImGuiColorMod> *this;
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImPlotContext *pIVar5;
  ImGuiColorMod *pIVar6;
  
  pIVar5 = GImPlot;
  if (count <= (GImPlot->ColorModifiers).Size) {
    this = &GImPlot->ColorModifiers;
    for (; 0 < count; count = count + -1) {
      pIVar6 = ImVector<ImGuiColorMod>::back(this);
      fVar2 = (pIVar6->BackupValue).y;
      fVar3 = (pIVar6->BackupValue).z;
      fVar4 = (pIVar6->BackupValue).w;
      pIVar1 = (pIVar5->Style).Colors + pIVar6->Col;
      pIVar1->x = (pIVar6->BackupValue).x;
      pIVar1->y = fVar2;
      pIVar1->z = fVar3;
      pIVar1->w = fVar4;
      ImVector<ImGuiColorMod>::pop_back(this);
    }
    return;
  }
  __assert_fail("(count <= gp.ColorModifiers.Size) && \"You can\'t pop more modifiers than have been pushed!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xca5,"void ImPlot::PopStyleColor(int)");
}

Assistant:

void PopStyleColor(int count) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(count <= gp.ColorModifiers.Size, "You can't pop more modifiers than have been pushed!");
    while (count > 0)
    {
        ImGuiColorMod& backup = gp.ColorModifiers.back();
        gp.Style.Colors[backup.Col] = backup.BackupValue;
        gp.ColorModifiers.pop_back();
        count--;
    }
}